

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O1

bool __thiscall
duckdb::TrySimpleIntegerCast<signed_char,true>
          (duckdb *this,char *buf,idx_t len,char *result,bool strict)

{
  duckdb *pdVar1;
  duckdb dVar2;
  duckdb dVar3;
  char *pcVar4;
  byte bVar5;
  char *pcVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  char cVar16;
  char *pcVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  char *pcVar21;
  ulong uVar22;
  bool bVar23;
  bool bVar24;
  IntegerCastData<short> local_5a;
  IntegerDecimalCastData<signed_char> local_58;
  ulong local_40;
  undefined1 *local_38;
  
  if (buf != (char *)0x0) {
    iVar8 = 3;
    iVar11 = 1;
    pcVar6 = (char *)0x0;
    do {
      dVar2 = this[(long)pcVar6];
      strict = SUB41((byte)dVar2 - 9,0);
      if ((4 < (byte)dVar2 - 9) && (dVar2 != (duckdb)0x20)) {
        if (dVar2 == (duckdb)0x2d) {
          pcVar17 = buf + -(long)pcVar6;
          strict = false;
          bVar24 = false;
          pcVar13 = &DAT_00000001;
          goto LAB_001e99e7;
        }
        if (dVar2 != (duckdb)0x30 || buf + -1 == pcVar6) {
LAB_001e9c37:
          uVar20 = (long)buf - (long)pcVar6;
          local_40 = (ulong)(dVar2 == (duckdb)0x2b);
          strict = false;
          bVar5 = 0;
          uVar12 = local_40;
          goto LAB_001e9c56;
        }
        dVar3 = (this + 1)[(long)pcVar6];
        if (dVar3 != (duckdb)0x42) {
          if (dVar3 != (duckdb)0x78) {
            if (dVar3 == (duckdb)0x62) goto LAB_001e9f70;
            if (dVar3 != (duckdb)0x58) goto LAB_001e9c37;
          }
          strict = false;
          bVar5 = 0;
          pcVar13 = &DAT_00000001;
          goto LAB_001e9b38;
        }
LAB_001e9f70:
        bVar24 = &DAT_00000001 < buf + ~(ulong)pcVar6;
        if (!bVar24) {
          strict = false;
          goto LAB_001e9a7d;
        }
        pcVar13 = &DAT_00000001;
        strict = false;
        goto LAB_001e9f86;
      }
      pcVar6 = pcVar6 + 1;
    } while (buf != pcVar6);
  }
  bVar24 = false;
  goto LAB_001e9a7d;
  while( true ) {
    pcVar19 = pcVar13 + 1;
    if ((int)strict < (int)(bVar5 - 0xb0) / 10) {
      bVar23 = false;
    }
    else {
      strict = (bool)((strict * '\n' - bVar5) + 0x30);
      bVar23 = true;
      if ((buf + ~(ulong)pcVar13 != pcVar6) && ((pcVar6 + 1)[(long)pcVar21] == '_')) {
        pcVar19 = pcVar13 + 2;
        if (buf + (-2 - (long)pcVar13) == pcVar6) {
          bVar23 = false;
        }
        else {
          bVar23 = (byte)(pcVar6[(long)(this + (long)pcVar19)] - 0x30U) < 10;
        }
      }
    }
    pcVar13 = pcVar19;
    if (!bVar23) break;
LAB_001e99e7:
    if (pcVar17 <= pcVar13) goto LAB_001ea250;
    pcVar21 = pcVar13 + (long)this;
    bVar5 = pcVar6[(long)pcVar21];
    if (9 < (byte)(bVar5 - 0x30)) {
      if (bVar5 == 0x2e) {
        pcVar19 = pcVar13 + 1;
        if (pcVar19 < pcVar17) {
          iVar8 = 0;
          if (9 < (byte)((pcVar6 + 1)[(long)pcVar21] - 0x30U)) goto LAB_001ea1ef;
          iVar11 = 1;
        }
        else {
          iVar8 = 3;
LAB_001ea1ef:
          iVar11 = 1;
          if (&DAT_00000001 < pcVar13) {
            iVar11 = iVar8;
          }
        }
        pcVar13 = pcVar19;
        if (iVar11 == 3) goto LAB_001ea250;
        if (iVar11 != 0) goto LAB_001ea2c3;
      }
      bVar24 = false;
      if (((ulong)(byte)pcVar6[(long)(this + (long)pcVar13)] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)pcVar6[(long)(this + (long)pcVar13)] & 0x3f) & 1) != 0)) {
        pcVar21 = pcVar13 + 1;
        pcVar13 = pcVar21;
        if (pcVar17 <= pcVar21) goto LAB_001ea250;
        goto LAB_001ea22d;
      }
      break;
    }
  }
  goto LAB_001e9a7d;
  while (pcVar21 = pcVar21 + 1, pcVar13 = pcVar17, pcVar17 != pcVar21) {
LAB_001ea22d:
    if ((0x20 < (ulong)(byte)pcVar6[(long)(this + (long)pcVar21)]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar6[(long)(this + (long)pcVar21)] & 0x3f) & 1) == 0))
    goto LAB_001ea2c3;
  }
LAB_001ea250:
  bVar24 = &DAT_00000001 < pcVar13;
  goto LAB_001e9a7d;
  while( true ) {
    uVar14 = uVar12 + 1;
    if ((char)((bVar10 ^ 0x7e) / 10) < (char)bVar5) {
      bVar23 = false;
    }
    else {
      strict = (bool)(bVar10 + bVar5 * '\n');
      bVar23 = true;
      bVar5 = strict;
      if ((buf + ~uVar12 != pcVar6) && ((pcVar6 + 1)[(long)pdVar1] == '_')) {
        uVar14 = uVar12 + 2;
        if (buf + (-2 - uVar12) == pcVar6) {
          bVar23 = false;
        }
        else {
          bVar23 = (byte)(pcVar6[(long)(this + uVar14)] - 0x30U) < 10;
        }
      }
    }
    bVar24 = false;
    uVar12 = uVar14;
    if (!bVar23) break;
LAB_001e9c56:
    if (uVar20 <= uVar12) goto LAB_001ea2b7;
    pdVar1 = this + uVar12;
    bVar10 = pcVar6[(long)pdVar1] - 0x30;
    if (9 < bVar10) {
      if (pcVar6[(long)pdVar1] == '.') {
        uVar14 = uVar12 + 1;
        if (((uVar20 <= uVar14) || (iVar8 = 0, 9 < (byte)((pcVar6 + 1)[(long)pdVar1] - 0x30U))) &&
           (local_40 < uVar12)) {
          iVar11 = iVar8;
        }
        uVar12 = uVar14;
        if (iVar11 == 3) goto LAB_001ea2b7;
        if (iVar11 != 0) goto LAB_001ea2c3;
      }
      bVar24 = false;
      if (((ulong)(byte)pcVar6[(long)(this + uVar12)] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)pcVar6[(long)(this + uVar12)] & 0x3f) & 1) != 0)) {
        uVar14 = uVar12 + 1;
        uVar12 = uVar14;
        if (uVar20 <= uVar14) goto LAB_001ea2b7;
        goto LAB_001ea298;
      }
      break;
    }
  }
  goto LAB_001e9a7d;
  while (uVar14 = uVar14 + 1, uVar12 = uVar20, uVar20 != uVar14) {
LAB_001ea298:
    if ((0x20 < (ulong)(byte)pcVar6[(long)(this + uVar14)]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar6[(long)(this + uVar14)] & 0x3f) & 1) == 0))
    goto LAB_001ea2c3;
  }
LAB_001ea2b7:
  bVar24 = local_40 < uVar12;
  goto LAB_001e9a7d;
LAB_001ea2c3:
  bVar24 = false;
  goto LAB_001e9a7d;
LAB_001e9b38:
  do {
    if (buf + ~(ulong)pcVar6 <= pcVar13) goto LAB_001ea250;
    pcVar17 = pcVar13 + (long)this;
    bVar10 = (pcVar6 + 1)[(long)pcVar17];
    bVar7 = bVar10 | 0x20;
    if (0x19 < (byte)(bVar10 + 0xbf)) {
      bVar7 = bVar10;
    }
    if (9 < (byte)(bVar7 - 0x30)) {
      bVar24 = false;
      if ((0x25 < bVar7 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar7 - 0x41) & 0x3f) & 1) == 0))
      break;
    }
    cVar16 = -0x30;
    if ('`' < (char)bVar7) {
      cVar16 = -0x57;
    }
    pcVar21 = pcVar13 + 1;
    if ((buf + (-2 - (long)pcVar13) == pcVar6) || ((pcVar6 + 2)[(long)pcVar17] != '_')) {
LAB_001e9bf8:
      bVar23 = (int)(char)bVar5 <= (int)(0x7f - (uint)(byte)(cVar16 + bVar7)) / 0x10;
      if (bVar23) {
        bVar5 = cVar16 + bVar7 + bVar5 * '\x10';
        strict = (bool)bVar5;
      }
    }
    else {
      pcVar21 = pcVar13 + 2;
      if (buf + (-3 - (long)pcVar13) != pcVar6) {
        if (9 < (byte)((pcVar6 + 3)[(long)pcVar17] - 0x30U)) {
          uVar9 = (byte)(pcVar6 + 3)[(long)pcVar17] - 0x41;
          bVar23 = false;
          if ((0x25 < uVar9) || (bVar23 = false, (0x3f0000003fU >> ((ulong)uVar9 & 0x3f) & 1) == 0))
          goto LAB_001e9c27;
        }
        goto LAB_001e9bf8;
      }
      bVar23 = false;
    }
LAB_001e9c27:
    bVar24 = false;
    pcVar13 = pcVar21;
  } while (bVar23);
  goto LAB_001e9a7d;
  while( true ) {
    bVar5 = pcVar6[(long)(this + uVar20)] - 0x30;
    if (9 < bVar5) {
      if (pcVar6[(long)(this + uVar20)] != '.') goto LAB_001ea50e;
      uVar14 = uVar20 + 1;
      if (uVar12 <= uVar14) {
        iVar8 = 3;
        uVar22 = uVar14;
        goto LAB_001ea4de;
      }
      local_58.decimal = 0;
      uVar15 = uVar14;
      goto LAB_001ea15f;
    }
    uVar14 = uVar20 + 1;
    if (local_58.result < (long)((ulong)bVar5 + 0x8000000000000000) / 10) {
      bVar24 = false;
    }
    else {
      local_58.result = local_58.result * 10 - (ulong)bVar5;
      bVar24 = true;
      if ((buf + ~uVar20 != pcVar6) && ((pcVar6 + 1)[(long)(this + uVar20)] == '_')) {
        uVar14 = uVar20 + 2;
        if (buf + (-2 - uVar20) == pcVar6) {
          bVar24 = false;
        }
        else {
          bVar24 = (byte)(pcVar6[(long)(this + uVar14)] - 0x30U) < 10;
        }
      }
    }
    uVar20 = uVar14;
    if (!bVar24) break;
LAB_001e9d2b:
    if (uVar12 <= uVar20) goto LAB_001ea11a;
  }
  goto LAB_001e9abf;
  while (uVar15 = uVar22, uVar22 < uVar12) {
LAB_001ea15f:
    bVar5 = pcVar6[(long)(this + uVar15)] - 0x30;
    if (9 < bVar5) {
      iVar8 = 0;
      goto LAB_001ea4d4;
    }
    if (local_58.decimal <= (long)(((ulong)bVar5 ^ 0x7ffffffffffffffe) / 10)) {
      local_58.decimal_digits = local_58.decimal_digits + 1;
      local_58.decimal = local_58.decimal * 10 + (ulong)bVar5;
    }
    uVar22 = uVar15 + 1;
    if (((buf + ~uVar15 != pcVar6) && ((pcVar6 + 1)[(long)(this + uVar15)] == '_')) &&
       ((uVar22 = uVar15 + 2, buf + (-2 - uVar15) == pcVar6 ||
        (9 < (byte)(pcVar6[(long)(this + uVar22)] - 0x30U))))) {
      local_58._18_6_ = 0;
      iVar11 = 1;
      goto LAB_001ea4f3;
    }
  }
  iVar8 = 3;
LAB_001ea4d4:
  local_58._18_6_ = 0;
  uVar22 = uVar15;
LAB_001ea4de:
  iVar11 = 1;
  if (uVar14 < uVar22) {
    iVar11 = iVar8;
  }
  if (1 < uVar20) {
    iVar11 = iVar8;
  }
LAB_001ea4f3:
  uVar20 = uVar22;
  if (iVar11 == 3) {
LAB_001ea11a:
    bVar24 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,true>
                       (&local_58);
    if (bVar24) {
      bVar24 = 1 < uVar20;
      goto LAB_001e9ac1;
    }
  }
  else if (iVar11 == 0) {
LAB_001ea50e:
    bVar5 = pcVar6[(long)(this + uVar20)];
    if (bVar5 - 9 < 5) {
LAB_001ea520:
      uVar14 = uVar20 + 1;
      uVar20 = uVar14;
      if (uVar14 < uVar12) {
        do {
          if ((0x20 < (ulong)(byte)pcVar6[(long)(this + uVar14)]) ||
             ((0x100003e00U >> ((ulong)(byte)pcVar6[(long)(this + uVar14)] & 0x3f) & 1) == 0))
          goto LAB_001e9abf;
          uVar14 = uVar14 + 1;
          uVar20 = uVar12;
        } while (uVar12 != uVar14);
      }
      goto LAB_001ea11a;
    }
    if ((bVar5 == 0x65) || (bVar5 == 0x45)) {
      if ((uVar20 != 1) && (uVar20 + 1 < uVar12)) {
        local_5a.result = 0;
        pcVar13 = pcVar6 + (long)(this + uVar20) + 1;
        pcVar6 = buf + (~(ulong)pcVar6 - uVar20);
        if (*pcVar13 == '-') {
          bVar24 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar13,(idx_t)pcVar6,&local_5a,SUB81(pcVar6,0));
        }
        else {
          bVar24 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar13,(idx_t)pcVar6,&local_5a,SUB81(pcVar6,0));
        }
        if (bVar24 != false) {
          bVar24 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<signed_char>,true>
                             (&local_58,local_5a.result);
          goto LAB_001e9ac1;
        }
      }
    }
    else if (bVar5 == 0x20) goto LAB_001ea520;
  }
  goto LAB_001e9abf;
  while( true ) {
    bVar5 = pcVar6[(long)(this + uVar20)] - 0x30;
    if (9 < bVar5) {
      if (pcVar6[(long)(this + uVar20)] != '.') goto LAB_001ea5fd;
      uVar15 = uVar20 + 1;
      if (uVar12 <= uVar15) {
        iVar8 = 3;
        uVar18 = uVar15;
        goto LAB_001ea5cb;
      }
      local_58.decimal = 0;
      uVar22 = uVar15;
      goto LAB_001ea3db;
    }
    uVar15 = uVar20 + 1;
    bVar24 = false;
    if (local_58.result <= (long)(((ulong)bVar5 ^ 0x7ffffffffffffffe) / 10)) {
      local_58.result = local_58.result * 10 + (ulong)bVar5;
      bVar24 = true;
      if ((buf + ~uVar20 != pcVar6) && ((pcVar6 + 1)[(long)(this + uVar20)] == '_')) {
        uVar15 = uVar20 + 2;
        if (buf + (-2 - uVar20) == pcVar6) {
          bVar24 = false;
        }
        else {
          bVar24 = (byte)(pcVar6[(long)(this + uVar15)] - 0x30U) < 10;
        }
      }
    }
    uVar20 = uVar15;
    if (!bVar24) break;
LAB_001ea055:
    if (uVar12 <= uVar20) goto LAB_001ea2d6;
  }
  goto LAB_001e9abf;
  while (uVar22 = uVar18, uVar18 < uVar12) {
LAB_001ea3db:
    bVar5 = pcVar6[(long)(this + uVar22)] - 0x30;
    local_40 = uVar15;
    if (9 < bVar5) {
      iVar8 = 0;
      goto LAB_001ea5bb;
    }
    if (local_58.decimal <= (long)(((ulong)bVar5 ^ 0x7ffffffffffffffe) / 10)) {
      local_58.decimal_digits = local_58.decimal_digits + 1;
      local_58.decimal = local_58.decimal * 10 + (ulong)bVar5;
    }
    uVar18 = uVar22 + 1;
    if (((buf + ~uVar22 != pcVar6) && ((pcVar6 + 1)[(long)(this + uVar22)] == '_')) &&
       ((uVar18 = uVar22 + 2, buf + (-2 - uVar22) == pcVar6 ||
        (9 < (byte)(pcVar6[(long)(this + uVar18)] - 0x30U))))) {
      local_58._18_6_ = 0;
      iVar11 = 1;
      goto LAB_001ea5df;
    }
  }
  iVar8 = 3;
LAB_001ea5bb:
  local_58._18_6_ = 0;
  uVar18 = uVar22;
LAB_001ea5cb:
  iVar11 = 1;
  if (uVar15 < uVar18) {
    iVar11 = iVar8;
  }
  if (uVar14 < uVar20) {
    iVar11 = iVar8;
  }
LAB_001ea5df:
  uVar20 = uVar18;
  if (iVar11 == 3) {
LAB_001ea2d6:
    bVar24 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>(&local_58);
    if (bVar24) {
      bVar24 = uVar14 < uVar20;
      goto LAB_001e9ac1;
    }
  }
  else if (iVar11 == 0) {
LAB_001ea5fd:
    bVar5 = pcVar6[(long)(this + uVar20)];
    if (bVar5 - 9 < 5) {
LAB_001ea612:
      uVar15 = uVar20 + 1;
      uVar20 = uVar15;
      if (uVar15 < uVar12) {
        do {
          if ((0x20 < (ulong)(byte)pcVar6[(long)(this + uVar15)]) ||
             ((0x100003e00U >> ((ulong)(byte)pcVar6[(long)(this + uVar15)] & 0x3f) & 1) == 0))
          goto LAB_001e9abf;
          uVar15 = uVar15 + 1;
          uVar20 = uVar12;
        } while (uVar12 != uVar15);
      }
      goto LAB_001ea2d6;
    }
    if ((bVar5 == 0x65) || (bVar5 == 0x45)) {
      if ((uVar20 != uVar14) && (uVar20 + 1 < uVar12)) {
        local_5a.result = 0;
        pcVar13 = pcVar6 + (long)(this + uVar20) + 1;
        pcVar6 = buf + (~(ulong)pcVar6 - uVar20);
        if (*pcVar13 == '-') {
          bVar24 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar13,(idx_t)pcVar6,&local_5a,SUB81(pcVar6,0));
        }
        else {
          bVar24 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar13,(idx_t)pcVar6,&local_5a,SUB81(pcVar6,0));
        }
        if (bVar24 != false) {
          bVar24 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<signed_char>,false>
                             (&local_58,local_5a.result);
          goto LAB_001e9ac1;
        }
      }
    }
    else if (bVar5 == 0x20) goto LAB_001ea612;
  }
  goto LAB_001e9abf;
LAB_001e9e5d:
  do {
    if (buf + ~(ulong)pcVar6 <= pcVar13) {
      bVar24 = IntegerDecimalCastOperation::
               Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>(&local_58);
      bVar24 = &DAT_00000001 < pcVar13 && bVar24;
      goto LAB_001e9ac1;
    }
    pcVar17 = pcVar13 + (long)this;
    bVar5 = (pcVar6 + 1)[(long)pcVar17];
    bVar10 = bVar5 | 0x20;
    if (0x19 < (byte)(bVar5 + 0xbf)) {
      bVar10 = bVar5;
    }
    if ((9 < (byte)(bVar10 - 0x30)) &&
       ((0x25 < bVar10 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar10 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar16 = -0x57;
    if ((char)bVar10 < 'a') {
      cVar16 = -0x30;
    }
    pcVar21 = pcVar13 + 1;
    if ((buf + (-2 - (long)pcVar13) == pcVar6) || ((pcVar6 + 2)[(long)pcVar17] != '_')) {
LAB_001e9f29:
      uVar12 = (ulong)((byte)(cVar16 + bVar10) >> 4) ^ 0x7ffffffffffffff;
      pcVar13 = (char *)local_58.result;
      if (local_58.result <= (long)uVar12) {
        pcVar13 = (char *)(local_58.result * 0x10 + (ulong)(byte)(cVar16 + bVar10));
      }
      bVar24 = local_58.result <= (long)uVar12;
      local_58.result = (StoreType)pcVar13;
    }
    else {
      pcVar21 = pcVar13 + 2;
      if (buf + (-3 - (long)pcVar13) != pcVar6) {
        if (9 < (byte)((pcVar6 + 3)[(long)pcVar17] - 0x30U)) {
          uVar9 = (byte)(pcVar6 + 3)[(long)pcVar17] - 0x41;
          bVar24 = false;
          if ((0x25 < uVar9) || (bVar24 = false, (0x3f0000003fU >> ((ulong)uVar9 & 0x3f) & 1) == 0))
          goto LAB_001e9f50;
        }
        goto LAB_001e9f29;
      }
      bVar24 = false;
    }
LAB_001e9f50:
    pcVar13 = pcVar21;
  } while (bVar24);
  goto LAB_001e9abf;
  while( true ) {
    pcVar17 = pcVar4;
    if (0x3fffffffffffffff < local_58.result) goto LAB_001e9abf;
    local_58.result = (StoreType)(pcVar19 + local_58.result * 2);
    if (pcVar13 <= pcVar17) break;
LAB_001ea31c:
    pcVar21 = pcVar17 + (long)this;
    if ((pcVar6 + 1)[(long)pcVar21] == '0') {
      pcVar19 = (char *)0x0;
    }
    else {
      pcVar19 = &DAT_00000001;
      if ((pcVar6 + 1)[(long)pcVar21] != '1') goto LAB_001e9abf;
    }
    pcVar4 = pcVar17 + 1;
    if ((buf + (-2 - (long)pcVar17) != pcVar6) && ((pcVar6 + 2)[(long)pcVar21] == '_')) {
      if ((buf + (-3 - (long)pcVar17) == pcVar6) || (((pcVar6 + 3)[(long)pcVar21] & 0xfeU) != 0x30))
      goto LAB_001e9abf;
      pcVar4 = pcVar17 + 2;
    }
  }
LAB_001ea396:
  bVar24 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                     (&local_58);
  bVar24 = bVar24 && &DAT_00000001 < pcVar13;
  goto LAB_001e9ac1;
LAB_001e9f86:
  do {
    pcVar17 = pcVar13 + (long)this;
    bVar5 = 0;
    if ((pcVar6 + 1)[(long)pcVar17] != '0') {
      if ((pcVar6 + 1)[(long)pcVar17] == '1') {
        bVar5 = 1;
        goto LAB_001e9fa4;
      }
LAB_001ea460:
      bVar24 = false;
      break;
    }
LAB_001e9fa4:
    pcVar21 = pcVar13 + 1;
    if ((buf + (-2 - (long)pcVar13) != pcVar6) && ((pcVar6 + 2)[(long)pcVar17] == '_')) {
      if ((buf + (-3 - (long)pcVar13) == pcVar6) || (((pcVar6 + 3)[(long)pcVar17] & 0xfeU) != 0x30))
      goto LAB_001ea460;
      pcVar21 = pcVar13 + 2;
    }
    pcVar13 = pcVar21;
    if ('?' < strict) goto LAB_001ea460;
    strict = (bool)(bVar5 | strict * '\x02');
    bVar24 = true;
  } while (pcVar13 < buf + ~(ulong)pcVar6);
LAB_001e9a7d:
  if (bVar24) {
    *(bool *)len = strict;
    bVar24 = true;
  }
  else {
    local_38 = (undefined1 *)len;
    if (buf != (char *)0x0) {
      pcVar6 = (char *)0x0;
      do {
        dVar2 = this[(long)pcVar6];
        if ((0x20 < (ulong)(byte)dVar2) || ((0x100003e00U >> ((ulong)(byte)dVar2 & 0x3f) & 1) == 0))
        {
          local_58.result = 0;
          local_58.decimal = 0;
          local_58._16_8_ = 0;
          uVar12 = (long)buf - (long)pcVar6;
          local_58.decimal_digits = 0;
          if (dVar2 == (duckdb)0x2d) {
            local_58.result = 0;
            uVar20 = 1;
            goto LAB_001e9d2b;
          }
          if (dVar2 != (duckdb)0x30 || buf + -1 == pcVar6) {
LAB_001ea044:
            uVar14 = (ulong)(dVar2 == (duckdb)0x2b);
            local_58.result = 0;
            uVar20 = uVar14;
            goto LAB_001ea055;
          }
          dVar3 = (this + 1)[(long)pcVar6];
          if (dVar3 != (duckdb)0x42) {
            if (dVar3 != (duckdb)0x78) {
              if (dVar3 == (duckdb)0x62) goto LAB_001ea2f3;
              if (dVar3 != (duckdb)0x58) goto LAB_001ea044;
            }
            local_58.result = 0;
            pcVar13 = &DAT_00000001;
            goto LAB_001e9e5d;
          }
LAB_001ea2f3:
          pcVar13 = buf + ~(ulong)pcVar6;
          if (pcVar13 < (char *)0x2) goto LAB_001ea396;
          local_58.result = 0;
          pcVar17 = &DAT_00000001;
          goto LAB_001ea31c;
        }
        pcVar6 = pcVar6 + 1;
      } while (buf != pcVar6);
    }
LAB_001e9abf:
    bVar24 = false;
LAB_001e9ac1:
    if (bVar24 != false) {
      *local_38 = (undefined1)local_58.result;
    }
  }
  return bVar24;
}

Assistant:

static inline bool TrySimpleIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	IntegerCastData<T> simple_data;
	if (TryIntegerCast<IntegerCastData<T>, IS_SIGNED, false, IntegerCastOperation>(buf, len, simple_data, strict)) {
		result = (T)simple_data.result;
		return true;
	}

	// Simple integer cast failed, try again with decimals/exponents included
	// FIXME: This could definitely be improved as some extra work is being done here. It is more important that
	//  "normal" integers (without exponent/decimals) are still being parsed quickly.
	IntegerDecimalCastData<T> cast_data;
	if (TryIntegerCast<IntegerDecimalCastData<T>, IS_SIGNED, true, IntegerDecimalCastOperation>(buf, len, cast_data,
	                                                                                            strict)) {
		result = (T)cast_data.result;
		return true;
	}
	return false;
}